

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtextures.c
# Opt level: O2

Texture2D * LoadTextureFromImage(Image image)

{
  uint uVar1;
  Texture2D *in_RDI;
  
  in_RDI->id = 0;
  if (image.height == 0 || image.width == 0) {
    TraceLog(4,"IMAGE: Data is not valid to load texture");
  }
  else {
    uVar1 = rlLoadTexture(image.data,image.width,image.height,image.format,image.mipmaps);
    in_RDI->id = uVar1;
  }
  in_RDI->width = image.width;
  in_RDI->height = image.height;
  in_RDI->mipmaps = image.mipmaps;
  in_RDI->format = image.format;
  return in_RDI;
}

Assistant:

Texture2D LoadTextureFromImage(Image image)
{
    Texture2D texture = { 0 };

    if ((image.width != 0) && (image.height != 0))
    {
        texture.id = rlLoadTexture(image.data, image.width, image.height, image.format, image.mipmaps);
    }
    else TRACELOG(LOG_WARNING, "IMAGE: Data is not valid to load texture");

    texture.width = image.width;
    texture.height = image.height;
    texture.mipmaps = image.mipmaps;
    texture.format = image.format;

    return texture;
}